

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::CapTableBuilder*,capnp::(anonymous_namespace)::MembraneCapTableBuilder*>&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::_::CapTableBuilder_*,_capnp::(anonymous_namespace)::MembraneCapTableBuilder_*>
          *params)

{
  char *pcVar1;
  size_t sVar2;
  String argValues [1];
  char **ppcVar3;
  undefined8 uVar4;
  char *local_a8;
  size_t sStack_a0;
  ArrayDisposer *pAStack_98;
  char **local_90;
  undefined8 uStack_88;
  String local_80;
  CappedArray<char,_17UL> local_68;
  CappedArray<char,_17UL> local_48;
  
  this->exception = (Exception *)0x0;
  Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(void **)file);
  Stringifier::operator*(&local_68,(Stringifier *)&_::STR,*(void **)(file + 8));
  concat<kj::CappedArray<char,17ul>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            (&local_80,(_ *)&local_48,(CappedArray<char,_17UL> *)(file + 0x10),
             (StringPtr *)&local_68,(CappedArray<char,_17UL> *)condition);
  ppcVar3 = &local_a8;
  local_a8 = local_80.content.ptr;
  sStack_a0 = local_80.content.size_;
  pAStack_98 = local_80.content.disposer;
  uStack_88 = 1;
  uVar4 = 1;
  local_90 = ppcVar3;
  init(this,(EVP_PKEY_CTX *)
            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
      );
  sVar2 = sStack_a0;
  pcVar1 = local_a8;
  if (local_a8 != (char *)0x0) {
    local_a8 = (char *)0x0;
    sStack_a0 = 0;
    (**pAStack_98->_vptr_ArrayDisposer)(pAStack_98,pcVar1,1,sVar2,sVar2,0,ppcVar3,uVar4);
  }
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}